

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCompositeDeepScanLine.cpp
# Opt level: O2

void anon_unknown.dwarf_6bac9::test_parts<Imath_3_2::half>
               (int pattern_number,int number_of_parts,bool load_depths,bool entire_buffer,
               string *tempDir)

{
  int iVar1;
  pointer pvVar2;
  pointer pvVar3;
  pointer pbVar4;
  pointer pHVar5;
  _Alloc_hider _Var6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  int *piVar12;
  ostream *poVar13;
  undefined4 *puVar14;
  data<Imath_3_2::half> *pdVar15;
  DeepScanLineInputPart *this;
  Box2i *pBVar16;
  pointer pvVar17;
  ulong uVar18;
  data<Imath_3_2::half> *pdVar19;
  ulong uVar20;
  size_t i;
  data<Imath_3_2::half> *pdVar21;
  string *psVar22;
  size_type sVar23;
  int iVar24;
  pointer *ppvVar25;
  long lVar26;
  size_t s_1;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  data<Imath_3_2::half> *__cur;
  data<Imath_3_2::half> *pdVar31;
  size_t c_1;
  long lVar32;
  vector<std::vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>,_std::allocator<std::vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>_>_>
  *this_00;
  bool bVar33;
  data<Imath_3_2::half> main;
  vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> headers;
  allocator<char> local_2e9;
  ulong local_2e8;
  size_type local_2e0;
  data<Imath_3_2::half> *local_2d8;
  vector<std::vector<Imath_3_2::half_*,_std::allocator<Imath_3_2::half_*>_>,_std::allocator<std::vector<Imath_3_2::half_*,_std::allocator<Imath_3_2::half_*>_>_>_>
  sample_pointers;
  vector<unsigned_int,_std::allocator<unsigned_int>_> counts;
  vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
  sample_buffers;
  vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> data;
  undefined1 local_208 [8];
  MultiPartOutputFile f;
  vector<(anonymous_namespace)::data<Imath_3_2::half>,_std::allocator<(anonymous_namespace)::data<Imath_3_2::half>_>_>
  local_1f0;
  data<Imath_3_2::half> *local_1d8;
  ulong local_1d0;
  string fn;
  ostringstream s;
  undefined1 local_1a0 [24];
  _Base_ptr local_188;
  size_t local_180;
  
  std::operator+(&fn,tempDir,"imf_test_composite_deep_scanline_source.exr");
  data<Imath_3_2::half>::data(&main);
  if (pattern_number == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&s,"Z",(allocator<char> *)&sample_buffers);
    data<Imath_3_2::half>::operator<<(&main,(string *)&s);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&data,"ZBack",(allocator<char> *)&headers);
    data<Imath_3_2::half>::operator<<(&main,(string *)&data);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&counts,"A",(allocator<char> *)&local_1f0);
    data<Imath_3_2::half>::operator<<(&main,(string *)&counts);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sample_pointers,"R",(allocator<char> *)&f);
    psVar22 = (string *)&sample_pointers;
    data<Imath_3_2::half>::operator<<(&main,psVar22);
    std::__cxx11::string::~string((string *)&sample_pointers);
    std::__cxx11::string::~string((string *)&counts);
    std::__cxx11::string::~string((string *)&data);
    std::__cxx11::string::~string((string *)&s);
    data<Imath_3_2::half>::operator<<(&main,1.0);
    data<Imath_3_2::half>::operator<<(&main,2.0);
    data<Imath_3_2::half>::operator<<(&main,0.0);
    data<Imath_3_2::half>::operator<<(&main,1.0);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,2.1);
    data<Imath_3_2::half>::operator<<(&main,2.3);
    data<Imath_3_2::half>::operator<<(&main,0.5);
    data<Imath_3_2::half>::operator<<(&main,0.4);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,(result *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,3.1);
    data<Imath_3_2::half>::operator<<(&main,4.3);
    data<Imath_3_2::half>::operator<<(&main,0.5);
    data<Imath_3_2::half>::operator<<(&main,1.4);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,10.0);
    data<Imath_3_2::half>::operator<<(&main,20.0);
    data<Imath_3_2::half>::operator<<(&main,1.0);
    data<Imath_3_2::half>::operator<<(&main,1.0);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,20.0);
    data<Imath_3_2::half>::operator<<(&main,30.0);
    data<Imath_3_2::half>::operator<<(&main,1.0);
    data<Imath_3_2::half>::operator<<(&main,2.0);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,(result *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,10.0);
    data<Imath_3_2::half>::operator<<(&main,20.0);
    data<Imath_3_2::half>::operator<<(&main,1.0);
    data<Imath_3_2::half>::operator<<(&main,1.0);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,(result *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,0.0);
    data<Imath_3_2::half>::operator<<(&main,0.0);
    data<Imath_3_2::half>::operator<<(&main,0.0);
    data<Imath_3_2::half>::operator<<(&main,0.0);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&s,"Z",(allocator<char> *)&headers)
    ;
    data<Imath_3_2::half>::operator<<(&main,(string *)&s);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&data,"R",(allocator<char> *)&local_1f0);
    data<Imath_3_2::half>::operator<<(&main,(string *)&data);
    std::__cxx11::string::string<std::allocator<char>>((string *)&counts,"G",(allocator<char> *)&f);
    data<Imath_3_2::half>::operator<<(&main,(string *)&counts);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sample_pointers,"B",(allocator<char> *)local_208);
    data<Imath_3_2::half>::operator<<(&main,(string *)&sample_pointers);
    std::__cxx11::string::string<std::allocator<char>>((string *)&sample_buffers,"A",&local_2e9);
    psVar22 = (string *)&sample_buffers;
    data<Imath_3_2::half>::operator<<(&main,psVar22);
    std::__cxx11::string::~string((string *)&sample_buffers);
    std::__cxx11::string::~string((string *)&sample_pointers);
    std::__cxx11::string::~string((string *)&counts);
    std::__cxx11::string::~string((string *)&data);
    std::__cxx11::string::~string((string *)&s);
    data<Imath_3_2::half>::operator<<(&main,1.0);
    data<Imath_3_2::half>::operator<<(&main,0.4);
    data<Imath_3_2::half>::operator<<(&main,1.25);
    data<Imath_3_2::half>::operator<<(&main,-0.1);
    data<Imath_3_2::half>::operator<<(&main,0.7);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,2.2);
    data<Imath_3_2::half>::operator<<(&main,0.2);
    data<Imath_3_2::half>::operator<<(&main,-0.1);
    data<Imath_3_2::half>::operator<<(&main,0.0);
    data<Imath_3_2::half>::operator<<(&main,0.24);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,2.3);
    data<Imath_3_2::half>::operator<<(&main,0.9);
    data<Imath_3_2::half>::operator<<(&main,0.56);
    data<Imath_3_2::half>::operator<<(&main,2.26);
    data<Imath_3_2::half>::operator<<(&main,0.9);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,5.0);
    data<Imath_3_2::half>::operator<<(&main,1.0);
    data<Imath_3_2::half>::operator<<(&main,0.5);
    data<Imath_3_2::half>::operator<<(&main,0.6);
    data<Imath_3_2::half>::operator<<(&main,0.2);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,(result *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,2.2984);
    data<Imath_3_2::half>::operator<<(&main,0.688);
    data<Imath_3_2::half>::operator<<(&main,1.35908);
    data<Imath_3_2::half>::operator<<(&main,0.42896);
    data<Imath_3_2::half>::operator<<(&main,0.9817);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,1.0);
    data<Imath_3_2::half>::operator<<(&main,0.4);
    data<Imath_3_2::half>::operator<<(&main,1.25);
    data<Imath_3_2::half>::operator<<(&main,-0.1);
    data<Imath_3_2::half>::operator<<(&main,0.7);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,2.2);
    data<Imath_3_2::half>::operator<<(&main,0.2);
    data<Imath_3_2::half>::operator<<(&main,-0.1);
    data<Imath_3_2::half>::operator<<(&main,0.0);
    data<Imath_3_2::half>::operator<<(&main,0.24);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,2.3);
    data<Imath_3_2::half>::operator<<(&main,0.9);
    data<Imath_3_2::half>::operator<<(&main,0.56);
    data<Imath_3_2::half>::operator<<(&main,2.26);
    data<Imath_3_2::half>::operator<<(&main,0.9);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,5.0);
    data<Imath_3_2::half>::operator<<(&main,1.0);
    data<Imath_3_2::half>::operator<<(&main,0.5);
    data<Imath_3_2::half>::operator<<(&main,0.6);
    data<Imath_3_2::half>::operator<<(&main,0.2);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,11.0);
    data<Imath_3_2::half>::operator<<(&main,0.4);
    data<Imath_3_2::half>::operator<<(&main,1.25);
    data<Imath_3_2::half>::operator<<(&main,-0.1);
    data<Imath_3_2::half>::operator<<(&main,0.7);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,12.2);
    data<Imath_3_2::half>::operator<<(&main,0.2);
    data<Imath_3_2::half>::operator<<(&main,-0.1);
    data<Imath_3_2::half>::operator<<(&main,0.0);
    data<Imath_3_2::half>::operator<<(&main,0.24);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,12.3);
    data<Imath_3_2::half>::operator<<(&main,0.9);
    data<Imath_3_2::half>::operator<<(&main,0.56);
    data<Imath_3_2::half>::operator<<(&main,2.26);
    data<Imath_3_2::half>::operator<<(&main,0.9);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,15.0);
    data<Imath_3_2::half>::operator<<(&main,1.0);
    data<Imath_3_2::half>::operator<<(&main,0.5);
    data<Imath_3_2::half>::operator<<(&main,0.6);
    data<Imath_3_2::half>::operator<<(&main,0.2);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,(result *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,2.62319);
    data<Imath_3_2::half>::operator<<(&main,0.7005);
    data<Imath_3_2::half>::operator<<(&main,1.38387);
    data<Imath_3_2::half>::operator<<(&main,0.43678);
    data<Imath_3_2::half>::operator<<(&main,0.99967);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,27.0);
    data<Imath_3_2::half>::operator<<(&main,1.0);
    data<Imath_3_2::half>::operator<<(&main,-1.0);
    data<Imath_3_2::half>::operator<<(&main,42.0);
    data<Imath_3_2::half>::operator<<(&main,14.0);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,(result *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,27.0);
    data<Imath_3_2::half>::operator<<(&main,1.0);
    data<Imath_3_2::half>::operator<<(&main,-1.0);
    data<Imath_3_2::half>::operator<<(&main,42.0);
    data<Imath_3_2::half>::operator<<(&main,14.0);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,1.0);
    data<Imath_3_2::half>::operator<<(&main,0.4);
    data<Imath_3_2::half>::operator<<(&main,1.25);
    data<Imath_3_2::half>::operator<<(&main,-0.1);
    data<Imath_3_2::half>::operator<<(&main,0.7);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,2.2);
    data<Imath_3_2::half>::operator<<(&main,0.2);
    data<Imath_3_2::half>::operator<<(&main,-0.1);
    data<Imath_3_2::half>::operator<<(&main,0.0);
    data<Imath_3_2::half>::operator<<(&main,0.24);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,2.3);
    data<Imath_3_2::half>::operator<<(&main,0.9);
    data<Imath_3_2::half>::operator<<(&main,0.56);
    data<Imath_3_2::half>::operator<<(&main,2.26);
    data<Imath_3_2::half>::operator<<(&main,0.9);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,5.0);
    data<Imath_3_2::half>::operator<<(&main,1.0);
    data<Imath_3_2::half>::operator<<(&main,0.5);
    data<Imath_3_2::half>::operator<<(&main,0.6);
    data<Imath_3_2::half>::operator<<(&main,0.2);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,(result *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,2.2984);
    data<Imath_3_2::half>::operator<<(&main,0.688);
    data<Imath_3_2::half>::operator<<(&main,1.35908);
    data<Imath_3_2::half>::operator<<(&main,0.42896);
    data<Imath_3_2::half>::operator<<(&main,0.9817);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,1.0);
    data<Imath_3_2::half>::operator<<(&main,0.4);
    data<Imath_3_2::half>::operator<<(&main,1.25);
    data<Imath_3_2::half>::operator<<(&main,-0.1);
    data<Imath_3_2::half>::operator<<(&main,0.7);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,2.2);
    data<Imath_3_2::half>::operator<<(&main,0.2);
    data<Imath_3_2::half>::operator<<(&main,-0.1);
    data<Imath_3_2::half>::operator<<(&main,0.0);
    data<Imath_3_2::half>::operator<<(&main,0.24);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,2.3);
    data<Imath_3_2::half>::operator<<(&main,0.9);
    data<Imath_3_2::half>::operator<<(&main,0.56);
    data<Imath_3_2::half>::operator<<(&main,2.26);
    data<Imath_3_2::half>::operator<<(&main,0.9);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,5.0);
    data<Imath_3_2::half>::operator<<(&main,1.0);
    data<Imath_3_2::half>::operator<<(&main,0.5);
    data<Imath_3_2::half>::operator<<(&main,0.6);
    data<Imath_3_2::half>::operator<<(&main,0.2);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,11.0);
    data<Imath_3_2::half>::operator<<(&main,0.4);
    data<Imath_3_2::half>::operator<<(&main,1.25);
    data<Imath_3_2::half>::operator<<(&main,-0.1);
    data<Imath_3_2::half>::operator<<(&main,0.7);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,12.2);
    data<Imath_3_2::half>::operator<<(&main,0.2);
    data<Imath_3_2::half>::operator<<(&main,-0.1);
    data<Imath_3_2::half>::operator<<(&main,0.0);
    data<Imath_3_2::half>::operator<<(&main,0.24);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,12.3);
    data<Imath_3_2::half>::operator<<(&main,0.9);
    data<Imath_3_2::half>::operator<<(&main,0.56);
    data<Imath_3_2::half>::operator<<(&main,2.26);
    data<Imath_3_2::half>::operator<<(&main,0.9);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,15.0);
    data<Imath_3_2::half>::operator<<(&main,1.0);
    data<Imath_3_2::half>::operator<<(&main,0.5);
    data<Imath_3_2::half>::operator<<(&main,0.6);
    data<Imath_3_2::half>::operator<<(&main,0.2);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,(result *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,2.62319);
    data<Imath_3_2::half>::operator<<(&main,0.7005);
    data<Imath_3_2::half>::operator<<(&main,1.38387);
    data<Imath_3_2::half>::operator<<(&main,0.43678);
    data<Imath_3_2::half>::operator<<(&main,0.99967);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,27.0);
    data<Imath_3_2::half>::operator<<(&main,1.0);
    data<Imath_3_2::half>::operator<<(&main,-1.0);
    data<Imath_3_2::half>::operator<<(&main,42.0);
    data<Imath_3_2::half>::operator<<(&main,14.0);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,(result *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,27.0);
    data<Imath_3_2::half>::operator<<(&main,1.0);
    data<Imath_3_2::half>::operator<<(&main,-1.0);
    data<Imath_3_2::half>::operator<<(&main,42.0);
    data<Imath_3_2::half>::operator<<(&main,14.0);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,1.0);
    data<Imath_3_2::half>::operator<<(&main,0.4);
    data<Imath_3_2::half>::operator<<(&main,1.25);
    data<Imath_3_2::half>::operator<<(&main,-0.1);
    data<Imath_3_2::half>::operator<<(&main,0.7);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,2.2);
    data<Imath_3_2::half>::operator<<(&main,0.2);
    data<Imath_3_2::half>::operator<<(&main,-0.1);
    data<Imath_3_2::half>::operator<<(&main,0.0);
    data<Imath_3_2::half>::operator<<(&main,0.24);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,2.3);
    data<Imath_3_2::half>::operator<<(&main,0.9);
    data<Imath_3_2::half>::operator<<(&main,0.56);
    data<Imath_3_2::half>::operator<<(&main,2.26);
    data<Imath_3_2::half>::operator<<(&main,0.9);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,5.0);
    data<Imath_3_2::half>::operator<<(&main,1.0);
    data<Imath_3_2::half>::operator<<(&main,0.5);
    data<Imath_3_2::half>::operator<<(&main,0.6);
    data<Imath_3_2::half>::operator<<(&main,0.2);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,(result *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,2.2984);
    data<Imath_3_2::half>::operator<<(&main,0.688);
    data<Imath_3_2::half>::operator<<(&main,1.35908);
    data<Imath_3_2::half>::operator<<(&main,0.42896);
    data<Imath_3_2::half>::operator<<(&main,0.9817);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,1.0);
    data<Imath_3_2::half>::operator<<(&main,0.4);
    data<Imath_3_2::half>::operator<<(&main,1.25);
    data<Imath_3_2::half>::operator<<(&main,-0.1);
    data<Imath_3_2::half>::operator<<(&main,0.7);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,2.2);
    data<Imath_3_2::half>::operator<<(&main,0.2);
    data<Imath_3_2::half>::operator<<(&main,-0.1);
    data<Imath_3_2::half>::operator<<(&main,0.0);
    data<Imath_3_2::half>::operator<<(&main,0.24);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,2.3);
    data<Imath_3_2::half>::operator<<(&main,0.9);
    data<Imath_3_2::half>::operator<<(&main,0.56);
    data<Imath_3_2::half>::operator<<(&main,2.26);
    data<Imath_3_2::half>::operator<<(&main,0.9);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,5.0);
    data<Imath_3_2::half>::operator<<(&main,1.0);
    data<Imath_3_2::half>::operator<<(&main,0.5);
    data<Imath_3_2::half>::operator<<(&main,0.6);
    data<Imath_3_2::half>::operator<<(&main,0.2);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,11.0);
    data<Imath_3_2::half>::operator<<(&main,0.4);
    data<Imath_3_2::half>::operator<<(&main,1.25);
    data<Imath_3_2::half>::operator<<(&main,-0.1);
    data<Imath_3_2::half>::operator<<(&main,0.7);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,12.2);
    data<Imath_3_2::half>::operator<<(&main,0.2);
    data<Imath_3_2::half>::operator<<(&main,-0.1);
    data<Imath_3_2::half>::operator<<(&main,0.0);
    data<Imath_3_2::half>::operator<<(&main,0.24);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,12.3);
    data<Imath_3_2::half>::operator<<(&main,0.9);
    data<Imath_3_2::half>::operator<<(&main,0.56);
    data<Imath_3_2::half>::operator<<(&main,2.26);
    data<Imath_3_2::half>::operator<<(&main,0.9);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,15.0);
    data<Imath_3_2::half>::operator<<(&main,1.0);
    data<Imath_3_2::half>::operator<<(&main,0.5);
    data<Imath_3_2::half>::operator<<(&main,0.6);
    data<Imath_3_2::half>::operator<<(&main,0.2);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,(result *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,2.62319);
    data<Imath_3_2::half>::operator<<(&main,0.7005);
    data<Imath_3_2::half>::operator<<(&main,1.38387);
    data<Imath_3_2::half>::operator<<(&main,0.43678);
    data<Imath_3_2::half>::operator<<(&main,0.99967);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,27.0);
    data<Imath_3_2::half>::operator<<(&main,1.0);
    data<Imath_3_2::half>::operator<<(&main,-1.0);
    data<Imath_3_2::half>::operator<<(&main,42.0);
    data<Imath_3_2::half>::operator<<(&main,14.0);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,(result *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,27.0);
    data<Imath_3_2::half>::operator<<(&main,1.0);
    data<Imath_3_2::half>::operator<<(&main,-1.0);
    data<Imath_3_2::half>::operator<<(&main,42.0);
    data<Imath_3_2::half>::operator<<(&main,14.0);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,1.0);
    data<Imath_3_2::half>::operator<<(&main,0.4);
    data<Imath_3_2::half>::operator<<(&main,1.25);
    data<Imath_3_2::half>::operator<<(&main,-0.1);
    data<Imath_3_2::half>::operator<<(&main,0.7);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,2.2);
    data<Imath_3_2::half>::operator<<(&main,0.2);
    data<Imath_3_2::half>::operator<<(&main,-0.1);
    data<Imath_3_2::half>::operator<<(&main,0.0);
    data<Imath_3_2::half>::operator<<(&main,0.24);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,2.3);
    data<Imath_3_2::half>::operator<<(&main,0.9);
    data<Imath_3_2::half>::operator<<(&main,0.56);
    data<Imath_3_2::half>::operator<<(&main,2.26);
    data<Imath_3_2::half>::operator<<(&main,0.9);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,5.0);
    data<Imath_3_2::half>::operator<<(&main,1.0);
    data<Imath_3_2::half>::operator<<(&main,0.5);
    data<Imath_3_2::half>::operator<<(&main,0.6);
    data<Imath_3_2::half>::operator<<(&main,0.2);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,(result *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,2.2984);
    data<Imath_3_2::half>::operator<<(&main,0.688);
    data<Imath_3_2::half>::operator<<(&main,1.35908);
    data<Imath_3_2::half>::operator<<(&main,0.42896);
    data<Imath_3_2::half>::operator<<(&main,0.9817);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,1.0);
    data<Imath_3_2::half>::operator<<(&main,0.4);
    data<Imath_3_2::half>::operator<<(&main,1.25);
    data<Imath_3_2::half>::operator<<(&main,-0.1);
    data<Imath_3_2::half>::operator<<(&main,0.7);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,2.2);
    data<Imath_3_2::half>::operator<<(&main,0.2);
    data<Imath_3_2::half>::operator<<(&main,-0.1);
    data<Imath_3_2::half>::operator<<(&main,0.0);
    data<Imath_3_2::half>::operator<<(&main,0.24);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,2.3);
    data<Imath_3_2::half>::operator<<(&main,0.9);
    data<Imath_3_2::half>::operator<<(&main,0.56);
    data<Imath_3_2::half>::operator<<(&main,2.26);
    data<Imath_3_2::half>::operator<<(&main,0.9);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,5.0);
    data<Imath_3_2::half>::operator<<(&main,1.0);
    data<Imath_3_2::half>::operator<<(&main,0.5);
    data<Imath_3_2::half>::operator<<(&main,0.6);
    data<Imath_3_2::half>::operator<<(&main,0.2);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,11.0);
    data<Imath_3_2::half>::operator<<(&main,0.4);
    data<Imath_3_2::half>::operator<<(&main,1.25);
    data<Imath_3_2::half>::operator<<(&main,-0.1);
    data<Imath_3_2::half>::operator<<(&main,0.7);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,12.2);
    data<Imath_3_2::half>::operator<<(&main,0.2);
    data<Imath_3_2::half>::operator<<(&main,-0.1);
    data<Imath_3_2::half>::operator<<(&main,0.0);
    data<Imath_3_2::half>::operator<<(&main,0.24);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,12.3);
    data<Imath_3_2::half>::operator<<(&main,0.9);
    data<Imath_3_2::half>::operator<<(&main,0.56);
    data<Imath_3_2::half>::operator<<(&main,2.26);
    data<Imath_3_2::half>::operator<<(&main,0.9);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,15.0);
    data<Imath_3_2::half>::operator<<(&main,1.0);
    data<Imath_3_2::half>::operator<<(&main,0.5);
    data<Imath_3_2::half>::operator<<(&main,0.6);
    data<Imath_3_2::half>::operator<<(&main,0.2);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,(result *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,2.62319);
    data<Imath_3_2::half>::operator<<(&main,0.7005);
    data<Imath_3_2::half>::operator<<(&main,1.38387);
    data<Imath_3_2::half>::operator<<(&main,0.43678);
    data<Imath_3_2::half>::operator<<(&main,0.99967);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,27.0);
    data<Imath_3_2::half>::operator<<(&main,1.0);
    data<Imath_3_2::half>::operator<<(&main,-1.0);
    data<Imath_3_2::half>::operator<<(&main,42.0);
    data<Imath_3_2::half>::operator<<(&main,14.0);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,(result *)psVar22);
    data<Imath_3_2::half>::operator<<(&main,27.0);
    data<Imath_3_2::half>::operator<<(&main,1.0);
    data<Imath_3_2::half>::operator<<(&main,-1.0);
    data<Imath_3_2::half>::operator<<(&main,42.0);
    data<Imath_3_2::half>::operator<<(&main,14.0);
    data<Imath_3_2::half>::operator<<(&main,(end *)psVar22);
  }
  _Var6._M_p = fn._M_dataplus._M_p;
  uVar20 = (ulong)(uint)number_of_parts;
  std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::vector
            (&headers,uVar20,(allocator_type *)&s);
  lVar11 = Imf_3_2::Header::displayWindow();
  *(undefined4 *)(lVar11 + 8) = 0xa4;
  lVar11 = Imf_3_2::Header::displayWindow();
  *(undefined4 *)(lVar11 + 0xc) = 0xd8;
  iVar7 = random_int(400);
  piVar12 = (int *)Imf_3_2::Header::dataWindow();
  *piVar12 = iVar7 + -200;
  piVar12 = (int *)Imf_3_2::Header::dataWindow();
  iVar7 = *piVar12;
  iVar8 = random_int(400);
  lVar11 = Imf_3_2::Header::dataWindow();
  *(int *)(lVar11 + 8) = iVar7 + iVar8 + 0x28;
  iVar7 = random_int(400);
  lVar11 = Imf_3_2::Header::dataWindow();
  *(int *)(lVar11 + 4) = iVar7 + -200;
  lVar11 = Imf_3_2::Header::dataWindow();
  iVar7 = *(int *)(lVar11 + 4);
  iVar8 = random_int(400);
  lVar11 = Imf_3_2::Header::dataWindow();
  *(int *)(lVar11 + 0xc) = iVar7 + iVar8 + 0x28;
  poVar13 = std::operator<<((ostream *)&std::cout,"data window: ");
  piVar12 = (int *)Imf_3_2::Header::dataWindow();
  poVar13 = (ostream *)std::ostream::operator<<(poVar13,*piVar12);
  poVar13 = std::operator<<(poVar13,',');
  lVar11 = Imf_3_2::Header::dataWindow();
  poVar13 = (ostream *)std::ostream::operator<<(poVar13,*(int *)(lVar11 + 4));
  poVar13 = std::operator<<(poVar13,' ');
  lVar11 = Imf_3_2::Header::dataWindow();
  poVar13 = (ostream *)std::ostream::operator<<(poVar13,*(int *)(lVar11 + 8));
  poVar13 = std::operator<<(poVar13,',');
  lVar11 = Imf_3_2::Header::dataWindow();
  poVar13 = (ostream *)std::ostream::operator<<(poVar13,*(int *)(lVar11 + 0xc));
  std::endl<char,std::char_traits<char>>(poVar13);
  Imf_3_2::Header::setType
            ((string *)
             headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
             super__Vector_impl_data._M_start);
  puVar14 = (undefined4 *)Imf_3_2::Header::compression();
  pHVar5 = headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
           super__Vector_impl_data._M_start;
  *puVar14 = 2;
  std::__cxx11::string::string<std::allocator<char>>((string *)&s,"Part0",(allocator<char> *)&data);
  local_2d8 = (data<Imath_3_2::half> *)_Var6._M_p;
  Imf_3_2::Header::setName((string *)pHVar5);
  std::__cxx11::string::~string((string *)&s);
  lVar32 = 0x38;
  for (lVar11 = 1; lVar11 < number_of_parts; lVar11 = lVar11 + 1) {
    Imf_3_2::Header::operator=
              (headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl
               .super__Vector_impl_data._M_start + lVar32,
               headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl
               .super__Vector_impl_data._M_start);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
    poVar13 = std::operator<<((ostream *)&s,"Part");
    std::ostream::operator<<(poVar13,(int)lVar11);
    pHVar5 = headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
             super__Vector_impl_data._M_start;
    std::__cxx11::stringbuf::str();
    Imf_3_2::Header::setName((string *)(pHVar5 + lVar32));
    std::__cxx11::string::~string((string *)&data);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
    lVar32 = lVar32 + 0x38;
  }
  pdVar15 = (data<Imath_3_2::half> *)operator_new(uVar20 * 0xa0);
  local_1f0.
  super__Vector_base<(anonymous_namespace)::data<Imath_3_2::half>,_std::allocator<(anonymous_namespace)::data<Imath_3_2::half>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pdVar15 + uVar20;
  local_1f0.
  super__Vector_base<(anonymous_namespace)::data<Imath_3_2::half>,_std::allocator<(anonymous_namespace)::data<Imath_3_2::half>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pdVar15;
  local_1f0.
  super__Vector_base<(anonymous_namespace)::data<Imath_3_2::half>,_std::allocator<(anonymous_namespace)::data<Imath_3_2::half>_>_>
  ._M_impl.super__Vector_impl_data._M_start = pdVar15;
  for (uVar18 = 0; uVar20 != uVar18; uVar18 = uVar18 + 1) {
    data<Imath_3_2::half>::data
              (local_1f0.
               super__Vector_base<(anonymous_namespace)::data<Imath_3_2::half>,_std::allocator<(anonymous_namespace)::data<Imath_3_2::half>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    local_1f0.
    super__Vector_base<(anonymous_namespace)::data<Imath_3_2::half>,_std::allocator<(anonymous_namespace)::data<Imath_3_2::half>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_1f0.
         super__Vector_base<(anonymous_namespace)::data<Imath_3_2::half>,_std::allocator<(anonymous_namespace)::data<Imath_3_2::half>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  if (1 < number_of_parts) {
    this_00 = &pdVar15->_samples;
    uVar27 = uVar20;
    while (bVar33 = uVar27 != 0, uVar27 = uVar27 - 1, bVar33) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)(this_00 + -6) + 0x10),&main._channels);
      std::
      vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
      ::operator=((vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
                   *)((long)(this_00 + -4) + 0x10),&main._results);
      *(PixelType *)(this_00 + 1) = main._type;
      std::
      vector<std::vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>,_std::allocator<std::vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>_>_>
      ::resize(this_00,((long)main._samples.
                              super__Vector_base<std::vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>,_std::allocator<std::vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)main._samples.
                             super__Vector_base<std::vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>,_std::allocator<std::vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x18);
      this_00 = (vector<std::vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>,_std::allocator<std::vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>_>_>
                 *)((long)(this_00 + 6) + 0x10);
    }
    pvVar17 = main._samples.
              super__Vector_base<std::vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>,_std::allocator<std::vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    for (uVar27 = 0;
        uVar27 < (ulong)(((long)main._samples.
                                super__Vector_base<std::vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>,_std::allocator<std::vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar17) / 0x18);
        uVar27 = uVar27 + 1) {
      lVar11 = 0;
      for (uVar28 = 0;
          uVar28 < (ulong)(((long)pvVar17[uVar27].
                                  super__Vector_base<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)pvVar17[uVar27].
                                 super__Vector_base<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0x18);
          uVar28 = uVar28 + 1) {
        iVar7 = random_int((int)uVar18);
        std::
        vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
        ::push_back(pdVar15[iVar7]._samples.
                    super__Vector_base<std::vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>,_std::allocator<std::vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar27,
                    (value_type *)
                    ((long)&((main._samples.
                              super__Vector_base<std::vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>,_std::allocator<std::vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar27].
                              super__Vector_base<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>).
                            _M_impl.super__Vector_impl_data + lVar11));
        lVar11 = lVar11 + 0x18;
        pvVar17 = main._samples.
                  super__Vector_base<std::vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>,_std::allocator<std::vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      }
    }
  }
  if (uVar20 == 1) {
    data<Imath_3_2::half>::setHeader
              (&main,headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>.
                     _M_impl.super__Vector_impl_data._M_start);
  }
  else {
    lVar11 = 0;
    uVar18 = 0;
    if (0 < number_of_parts) {
      uVar18 = (ulong)(uint)number_of_parts;
    }
    pdVar19 = pdVar15;
    for (; uVar18 * 0x38 - lVar11 != 0; lVar11 = lVar11 + 0x38) {
      data<Imath_3_2::half>::setHeader
                (pdVar19,headers.
                         super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar11);
      pdVar19 = pdVar19 + 1;
    }
  }
  iVar7 = Imf_3_2::globalThreadCount();
  uVar18 = 0;
  Imf_3_2::MultiPartOutputFile::MultiPartOutputFile
            (&f,(char *)local_2d8,
             headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
             super__Vector_impl_data._M_start,
             (int)(((long)headers.
                          super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)headers.
                         super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>.
                         _M_impl.super__Vector_impl_data._M_start) / 0x38),false,iVar7);
  local_1d8 = pdVar15;
  uVar27 = (ulong)(uint)number_of_parts;
  if (number_of_parts < 1) {
    uVar27 = uVar18;
  }
  while( true ) {
    if (uVar18 == uVar27) break;
    Imf_3_2::DeepScanLineOutputPart::DeepScanLineOutputPart
              ((DeepScanLineOutputPart *)local_208,&f,(int)uVar18);
    pdVar15 = pdVar15 + uVar18;
    local_2d8 = pdVar15;
    if (number_of_parts == 1) {
      local_2d8 = &main;
    }
    Imf_3_2::DeepScanLineOutputPart::header();
    piVar12 = (int *)Imf_3_2::Header::dataWindow();
    iVar7 = *piVar12;
    iVar8 = piVar12[1];
    iVar1 = piVar12[2];
    iVar10 = piVar12[3];
    iVar24 = (iVar1 - iVar7) + 1;
    if (iVar10 < iVar8 || iVar1 < iVar7) {
      iVar24 = 1;
    }
    iVar9 = (iVar10 - iVar8) + 1;
    if (iVar10 < iVar8 || iVar1 < iVar7) {
      iVar9 = 1;
    }
    pdVar19 = pdVar15;
    if (number_of_parts == 1) {
      pdVar19 = &main;
    }
    pvVar17 = (pdVar19->_samples).
              super__Vector_base<std::vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>,_std::allocator<std::vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar11 = ((long)(pdVar19->_samples).
                    super__Vector_base<std::vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>,_std::allocator<std::vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar17) / 0x18;
    ppvVar25 = (pointer *)
               ((long)&(pvVar17->
                       super__Vector_base<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
                       )._M_impl.super__Vector_impl_data + 8);
    lVar32 = 0;
    while (bVar33 = lVar11 != 0, lVar11 = lVar11 + -1, bVar33) {
      lVar32 = lVar32 + ((long)*ppvVar25 - (long)((_Vector_impl_data *)(ppvVar25 + -1))->_M_start) /
                        0x18;
      ppvVar25 = ppvVar25 + 3;
    }
    local_2e0 = (size_type)(iVar24 * iVar9);
    local_2e8 = local_2e0 /
                (ulong)(((long)(pdVar19->_results).
                               super__Vector_base<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pdVar19->_results).
                              super__Vector_base<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x18);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&counts,local_2e0,(allocator_type *)&s);
    pdVar21 = local_2d8;
    pdVar31 = pdVar15;
    if (number_of_parts == 1) {
      pdVar31 = &main;
    }
    std::
    vector<std::vector<Imath_3_2::half_*,_std::allocator<Imath_3_2::half_*>_>,_std::allocator<std::vector<Imath_3_2::half_*,_std::allocator<Imath_3_2::half_*>_>_>_>
    ::vector(&sample_pointers,
             (long)(pdVar31->_channels).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(local_2d8->_channels).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&s);
    local_1d0 = uVar18;
    std::
    vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
    ::vector(&sample_buffers,
             (long)(pdVar31->_channels).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(pdVar21->_channels).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&s);
    lVar11 = local_2e8 + 1;
    lVar29 = 0;
    for (uVar18 = 0; pdVar21 = local_2d8,
        uVar18 < (ulong)(((long)sample_buffers.
                                super__Vector_base<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)sample_buffers.
                               super__Vector_base<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x18);
        uVar18 = uVar18 + 1) {
      std::vector<Imath_3_2::half_*,_std::allocator<Imath_3_2::half_*>_>::resize
                ((vector<Imath_3_2::half_*,_std::allocator<Imath_3_2::half_*>_> *)
                 ((long)&((sample_pointers.
                           super__Vector_base<std::vector<Imath_3_2::half_*,_std::allocator<Imath_3_2::half_*>_>,_std::allocator<std::vector<Imath_3_2::half_*,_std::allocator<Imath_3_2::half_*>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<Imath_3_2::half_*,_std::allocator<Imath_3_2::half_*>_>).
                         _M_impl.super__Vector_impl_data._M_start + lVar29),local_2e0);
      std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::resize
                ((vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> *)
                 ((long)&((sample_buffers.
                           super__Vector_base<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>).
                         _M_impl.super__Vector_impl_data._M_start + lVar29),lVar32 * lVar11);
      lVar29 = lVar29 + 0x18;
    }
    uVar18 = 0;
    lVar11 = 0;
    for (sVar23 = 0; sVar23 != local_2e0; sVar23 = sVar23 + 1) {
      pvVar17 = (pdVar19->_samples).
                super__Vector_base<std::vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>,_std::allocator<std::vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_2e8 = uVar18;
      pvVar2 = *(pointer *)
                ((long)&pvVar17[uVar18].
                        super__Vector_base<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
                        ._M_impl.super__Vector_impl_data + 8);
      pvVar3 = pvVar17[uVar18].
               super__Vector_base<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar32 = ((long)pvVar2 - (long)pvVar3) / 0x18;
      counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[sVar23] = (uint)lVar32;
      if (pvVar2 != pvVar3) {
        for (uVar28 = 0;
            uVar28 < (ulong)((long)(pdVar31->_channels).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(local_2d8->_channels).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5);
            uVar28 = uVar28 + 1) {
          pvVar17 = (pdVar19->_samples).
                    super__Vector_base<std::vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>,_std::allocator<std::vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar30 = 0;
          lVar29 = lVar11;
          lVar26 = lVar32;
          while (bVar33 = lVar26 != 0, lVar26 = lVar26 + -1, bVar33) {
            sample_buffers.
            super__Vector_base<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar28].
            super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl.
            super__Vector_impl_data._M_start[lVar29]._h =
                 *(uint16_t *)
                  (*(long *)(*(long *)&pvVar17[uVar18].
                                       super__Vector_base<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
                                       ._M_impl.super__Vector_impl_data + lVar30) + uVar28 * 2);
            lVar29 = lVar29 + 1;
            lVar30 = lVar30 + 0x18;
          }
          sample_pointers.
          super__Vector_base<std::vector<Imath_3_2::half_*,_std::allocator<Imath_3_2::half_*>_>,_std::allocator<std::vector<Imath_3_2::half_*,_std::allocator<Imath_3_2::half_*>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar28].
          super__Vector_base<Imath_3_2::half_*,_std::allocator<Imath_3_2::half_*>_>._M_impl.
          super__Vector_impl_data._M_start[sVar23] =
               sample_buffers.
               super__Vector_base<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar28].
               super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl.
               super__Vector_impl_data._M_start + lVar11;
        }
        lVar11 = lVar11 + lVar32;
      }
      uVar18 = uVar18 + 1;
      if (uVar18 == ((long)(pdVar19->_samples).
                           super__Vector_base<std::vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>,_std::allocator<std::vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pdVar19->_samples).
                          super__Vector_base<std::vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>,_std::allocator<std::vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x18) {
        uVar18 = 0;
      }
    }
    poVar13 = std::operator<<((ostream *)&std::cout," wrote ");
    poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
    poVar13 = std::operator<<(poVar13," samples  into ");
    poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
    std::operator<<(poVar13," pixels\n");
    Imf_3_2::DeepFrameBuffer::DeepFrameBuffer((DeepFrameBuffer *)&s);
    local_2e0 = (size_type)(iVar8 * iVar24);
    local_2e8 = (ulong)iVar24;
    Imf_3_2::Slice::Slice
              ((Slice *)&data,UINT,
               (char *)(counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start + (-(long)iVar7 - local_2e0)),4,
               local_2e8 * 4,1,1,0.0,false,false);
    Imf_3_2::DeepFrameBuffer::insertSampleCountSlice((Slice *)&s);
    local_2e0 = -local_2e0;
    if (number_of_parts == 1) {
      pdVar15 = &main;
    }
    local_2e8 = local_2e8 << 3;
    lVar32 = 0;
    lVar11 = 0;
    for (uVar18 = 0;
        pbVar4 = (pdVar21->_channels).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar18 < (ulong)((long)(pdVar31->_channels).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5);
        uVar18 = uVar18 + 1) {
      Imf_3_2::DeepSlice::DeepSlice
                ((DeepSlice *)&data,pdVar15->_type,
                 (char *)(*(long *)((long)&((sample_pointers.
                                             super__Vector_base<std::vector<Imath_3_2::half_*,_std::allocator<Imath_3_2::half_*>_>,_std::allocator<std::vector<Imath_3_2::half_*,_std::allocator<Imath_3_2::half_*>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->
                                           super__Vector_base<Imath_3_2::half_*,_std::allocator<Imath_3_2::half_*>_>
                                           )._M_impl.super__Vector_impl_data._M_start + lVar32) +
                          (long)iVar7 * -8 + local_2e0 * 8),8,local_2e8,2,1,1,0.0,false,false);
      Imf_3_2::DeepFrameBuffer::insert
                ((string *)&s,(DeepSlice *)((long)&(pbVar4->_M_dataplus)._M_p + lVar11));
      lVar11 = lVar11 + 0x20;
      lVar32 = lVar32 + 0x18;
      pdVar21 = local_2d8;
    }
    Imf_3_2::DeepScanLineOutputPart::setFrameBuffer((DeepFrameBuffer *)local_208);
    Imf_3_2::DeepScanLineOutputPart::writePixels((int)(DeepFrameBuffer *)local_208);
    uVar18 = local_1d0;
    pdVar15 = local_1d8;
    std::
    _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
                 *)&s);
    std::
    vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
    ::~vector(&sample_buffers);
    std::
    vector<std::vector<Imath_3_2::half_*,_std::allocator<Imath_3_2::half_*>_>,_std::allocator<std::vector<Imath_3_2::half_*,_std::allocator<Imath_3_2::half_*>_>_>_>
    ::~vector(&sample_pointers);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    uVar18 = uVar18 + 1;
  }
  Imf_3_2::MultiPartOutputFile::~MultiPartOutputFile(&f);
  std::
  vector<(anonymous_namespace)::data<Imath_3_2::half>,_std::allocator<(anonymous_namespace)::data<Imath_3_2::half>_>_>
  ::~vector(&local_1f0);
  std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::~vector(&headers);
  data.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Imf_3_2::CompositeDeepScanLine::CompositeDeepScanLine((CompositeDeepScanLine *)&sample_pointers);
  _Var6 = fn._M_dataplus;
  local_1a0._0_4_ = _S_red;
  local_1a0._8_8_ = 0;
  local_1a0._16_8_ = local_1a0;
  local_180 = 0;
  local_188 = (_Base_ptr)local_1a0._16_8_;
  iVar7 = Imf_3_2::globalThreadCount();
  Imf_3_2::MultiPartInputFile::MultiPartInputFile
            ((MultiPartInputFile *)&sample_buffers,_Var6._M_p,iVar7,true);
  std::vector<Imf_3_2::DeepScanLineInputPart_*,_std::allocator<Imf_3_2::DeepScanLineInputPart_*>_>::
  vector((vector<Imf_3_2::DeepScanLineInputPart_*,_std::allocator<Imf_3_2::DeepScanLineInputPart_*>_>
          *)&counts,uVar20,(allocator_type *)&headers);
  for (uVar20 = 0; uVar27 != uVar20; uVar20 = uVar20 + 1) {
    this = (DeepScanLineInputPart *)operator_new(8);
    Imf_3_2::DeepScanLineInputPart::DeepScanLineInputPart
              (this,(MultiPartInputFile *)&sample_buffers,(int)uVar20);
    *(DeepScanLineInputPart **)
     (counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start + uVar20 * 2) = this;
    Imf_3_2::CompositeDeepScanLine::addSource((DeepScanLineInputPart *)&sample_pointers);
  }
  pBVar16 = (Box2i *)Imf_3_2::CompositeDeepScanLine::dataWindow();
  data<Imath_3_2::half>::setUpFrameBuffer(&main,&data,(FrameBuffer *)&s,pBVar16,load_depths);
  Imf_3_2::CompositeDeepScanLine::setFrameBuffer((FrameBuffer *)&sample_pointers);
  if (entire_buffer) {
    lVar11 = Imf_3_2::CompositeDeepScanLine::dataWindow();
    iVar7 = *(int *)(lVar11 + 4);
    Imf_3_2::CompositeDeepScanLine::dataWindow();
    Imf_3_2::CompositeDeepScanLine::readPixels((int)&sample_pointers,iVar7);
  }
  else {
    lVar11 = Imf_3_2::CompositeDeepScanLine::dataWindow();
    iVar7 = *(int *)(lVar11 + 4);
    while (lVar11 = Imf_3_2::CompositeDeepScanLine::dataWindow(), iVar7 < *(int *)(lVar11 + 0xc)) {
      iVar8 = random_int(0x40);
      lVar11 = Imf_3_2::CompositeDeepScanLine::dataWindow();
      iVar8 = iVar8 + iVar7;
      if (*(int *)(lVar11 + 0xc) < iVar8) {
        lVar11 = Imf_3_2::CompositeDeepScanLine::dataWindow();
        iVar8 = *(int *)(lVar11 + 0xc);
      }
      Imf_3_2::CompositeDeepScanLine::readPixels((int)&sample_pointers,iVar7);
      iVar7 = iVar8;
    }
  }
  pBVar16 = (Box2i *)Imf_3_2::CompositeDeepScanLine::dataWindow();
  data<Imath_3_2::half>::checkValues(&main,&data,pBVar16,load_depths);
  for (uVar20 = 0; uVar27 != uVar20; uVar20 = uVar20 + 1) {
    operator_delete(*(void **)(counts.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start + uVar20 * 2),8);
  }
  std::
  _Vector_base<Imf_3_2::DeepScanLineInputPart_*,_std::allocator<Imf_3_2::DeepScanLineInputPart_*>_>
  ::~_Vector_base((_Vector_base<Imf_3_2::DeepScanLineInputPart_*,_std::allocator<Imf_3_2::DeepScanLineInputPart_*>_>
                   *)&counts);
  Imf_3_2::MultiPartInputFile::~MultiPartInputFile((MultiPartInputFile *)&sample_buffers);
  std::
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
               *)&s);
  Imf_3_2::CompositeDeepScanLine::~CompositeDeepScanLine((CompositeDeepScanLine *)&sample_pointers);
  std::_Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::~_Vector_base
            (&data.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>);
  _Var6 = fn._M_dataplus;
  if (number_of_parts == 1) {
    iVar7 = Imf_3_2::globalThreadCount();
    Imf_3_2::InputFile::InputFile((InputFile *)&counts,_Var6._M_p,iVar7);
    data.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    data.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    data.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1a0._0_4_ = _S_red;
    local_1a0._8_8_ = 0;
    local_1a0._16_8_ = local_1a0;
    local_180 = 0;
    local_188 = (_Base_ptr)local_1a0._16_8_;
    Imf_3_2::InputFile::header();
    pBVar16 = (Box2i *)Imf_3_2::Header::dataWindow();
    data<Imath_3_2::half>::setUpFrameBuffer(&main,&data,(FrameBuffer *)&s,pBVar16,load_depths);
    Imf_3_2::InputFile::setFrameBuffer((FrameBuffer *)&counts);
    iVar7 = (pBVar16->min).y;
    if (entire_buffer) {
      Imf_3_2::InputFile::readPixels((int)&counts,iVar7);
    }
    else {
      while (iVar7 < (pBVar16->max).y) {
        iVar10 = random_int(0x40);
        iVar8 = (pBVar16->max).y;
        iVar1 = iVar10 + iVar7;
        if (iVar8 <= iVar10 + iVar7) {
          iVar1 = iVar8;
        }
        Imf_3_2::InputFile::readPixels((int)&counts,iVar7);
        iVar7 = iVar1;
      }
    }
    data<Imath_3_2::half>::checkValues(&main,&data,pBVar16,load_depths);
    std::
    _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                 *)&s);
    std::_Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::~_Vector_base
              (&data.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>);
    Imf_3_2::InputFile::~InputFile((InputFile *)&counts);
  }
  remove(fn._M_dataplus._M_p);
  data<Imath_3_2::half>::~data(&main);
  std::__cxx11::string::~string((string *)&fn);
  return;
}

Assistant:

void
test_parts (
    int                pattern_number,
    int                number_of_parts,
    bool               load_depths,
    bool               entire_buffer,
    const std::string& tempDir)
{
    std::string fn = tempDir + "imf_test_composite_deep_scanline_source.exr";

    data<T> main;
    make_pattern (main, pattern_number);
    write_file (fn.c_str (), main, number_of_parts);

    {
        vector<T>                      data;
        CompositeDeepScanLine          comp;
        FrameBuffer                    testbuf;
        MultiPartInputFile             input (fn.c_str ());
        vector<DeepScanLineInputPart*> parts (number_of_parts);

        // use 'part' interface TODO test file interface too
        for (int i = 0; i < number_of_parts; i++)
        {
            parts[i] = new DeepScanLineInputPart (input, i);
            comp.addSource (parts[i]);
        }

        main.setUpFrameBuffer (
            data, testbuf, comp.dataWindow (), load_depths);

        comp.setFrameBuffer (testbuf);

        //
        // try loading the whole buffer
        //
        if (entire_buffer)
        {
            comp.readPixels (
                comp.dataWindow ().min.y, comp.dataWindow ().max.y);
        }
        else
        {
            int low = comp.dataWindow ().min.y;
            while (low < comp.dataWindow ().max.y)
            {
                int high = low + random_int (64);
                if (high > comp.dataWindow ().max.y)
                    high = comp.dataWindow ().max.y;
                comp.readPixels (low, high);
                low = high;
            }
        }

        main.checkValues (data, comp.dataWindow (), load_depths);

        for (int i = 0; i < number_of_parts; i++)
        {
            delete parts[i];
        }
    }
    if (number_of_parts == 1)
    {
        // also test InputFile interface
        InputFile    file (fn.c_str ());
        vector<T>    data;
        FrameBuffer  testbuf;
        const Box2i& dataWindow = file.header ().dataWindow ();
        main.setUpFrameBuffer (data, testbuf, dataWindow, load_depths);
        file.setFrameBuffer (testbuf);
        if (entire_buffer)
        {
            file.readPixels (dataWindow.min.y, dataWindow.max.y);
        }
        else
        {
            int low = dataWindow.min.y;
            while (low < dataWindow.max.y)
            {
                int high = low + random_int (64);
                if (high > dataWindow.max.y) high = dataWindow.max.y;
                file.readPixels (low, high);
                low = high;
            }
        }

        main.checkValues (data, dataWindow, load_depths);
    }
    remove (fn.c_str ());
}